

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
EqualRange<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(EqualRange<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  iterator __first;
  iterator __first_00;
  iterator __last;
  iterator __last_00;
  bool bVar1;
  back_insert_iterator<std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  bVar2;
  iterator first;
  iterator last;
  reference ppVar3;
  char *pcVar4;
  reference __in;
  type_conflict1 *rhs;
  Message *message;
  anon_union_8_1_a8a14541_for_iterator_1 in_stack_fffffffffffff858;
  AssertHelper local_748;
  string local_740;
  Message local_720;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_2;
  Message local_700 [7];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  difference_type local_690;
  int local_684;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_1;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator>
  r_1;
  pair<const_int,_int> *p_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *__range2_1;
  AssertHelper local_5d8;
  Message local_5d0 [7];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  difference_type local_568;
  int local_55c;
  undefined1 local_558 [8];
  AssertionResult gtest_ar;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator>
  r;
  pair<const_int,_int> *p;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *__range2;
  TypeParam m;
  undefined1 local_28 [8];
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> values;
  EqualRange<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  values.super__Vector_base<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::vector
            ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28);
  bVar2 = std::
          back_inserter<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>
                    ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_28);
  m.
  super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       std::
       generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,int>,void>>
                 (bVar2.container,10);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)&__range2);
  __end0 = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::
           begin((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_28);
  p = (pair<const_int,_int> *)
      std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                                     *)&p), bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
             ::operator*(&__end0);
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    ::equal_range<int>((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator>
                        *)&gtest_ar.message_,
                       (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                        *)&__range2,&ppVar3->first);
    local_55c = 0;
    local_598.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    __first.inner_end_ = r.first.inner_end_;
    __first.inner_ = r.first.inner_;
    __first.it_.ctrl_ = r.first.it_.ctrl_;
    __first.it_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)r.first.it_.field_1.slot_;
    __first.it_end_.ctrl_ = r.first.it_end_.ctrl_;
    __first.it_end_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)r.first.it_end_.field_1.slot_;
    __last.inner_end_ = r.second.inner_end_;
    __last.inner_ = r.second.inner_;
    __last.it_.ctrl_ = r.second.it_.ctrl_;
    __last.it_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)r.second.it_.field_1.slot_;
    __last.it_end_.ctrl_ = r.second.it_end_.ctrl_;
    __last.it_end_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)in_stack_fffffffffffff858.slot_;
    local_568 = std::
                distance<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::iterator>
                          (__first,__last);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_558,"0","std::distance(r.first, r.second)",&local_55c,&local_568);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
    if (!bVar1) {
      testing::Message::Message(local_5d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
      testing::internal::AssertHelper::AssertHelper
                (&local_5d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x6b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5d8,local_5d0);
      testing::internal::AssertHelper::~AssertHelper(&local_5d8);
      testing::Message::~Message(local_5d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
    if (!bVar1) goto LAB_0028cf72;
    __gnu_cxx::
    __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::operator++(&__end0);
  }
  first = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                    ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_28);
  last = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_28);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<int_const,int>*,std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&__range2,
             (__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              )last._M_current);
  __end0_1 = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::
             begin((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *
                   )local_28);
  p_1 = (pair<const_int,_int> *)
        std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                  ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *
                   )local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                             *)&p_1), bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
             ::operator*(&__end0_1);
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    ::equal_range<int>((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator>
                        *)&gtest_ar_1.message_,
                       (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                        *)&__range2,&ppVar3->first);
    local_684 = 1;
    local_6c8.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    __first_00.inner_end_ = r_1.first.inner_end_;
    __first_00.inner_ = r_1.first.inner_;
    __first_00.it_.ctrl_ = r_1.first.it_.ctrl_;
    __first_00.it_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)r_1.first.it_.field_1.slot_;
    __first_00.it_end_.ctrl_ = r_1.first.it_end_.ctrl_;
    __first_00.it_end_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)r_1.first.it_end_.field_1.slot_;
    __last_00.inner_end_ = r_1.second.inner_end_;
    __last_00.inner_ = r_1.second.inner_;
    __last_00.it_.ctrl_ = r_1.second.it_.ctrl_;
    __last_00.it_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)r_1.second.it_.field_1.slot_;
    __last_00.it_end_.ctrl_ = r_1.second.it_end_.ctrl_;
    __last_00.it_end_.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)in_stack_fffffffffffff858.slot_;
    local_690 = std::
                distance<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>::iterator>
                          (__first_00,__last_00);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_680,"1","std::distance(r.first, r.second)",&local_684,&local_690);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
    if (!bVar1) {
      testing::Message::Message(local_700);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x70,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_700);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_700);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
    if (!bVar1) break;
    __in = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
           ::iterator::operator*((iterator *)&gtest_ar_1.message_);
    rhs = std::get<1ul,int_const,int>(__in);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_718,"p.second","get<1>(*r.first)",&ppVar3->second,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
    if (!bVar1) {
      testing::Message::Message(&local_720);
      testing::PrintToString<int>(&local_740,&ppVar3->first);
      message = testing::Message::operator<<(&local_720,&local_740);
      in_stack_fffffffffffff858.slot_ =
           (slot_type *)testing::AssertionResult::failure_message((AssertionResult *)local_718);
      testing::internal::AssertHelper::AssertHelper
                (&local_748,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x71,(char *)in_stack_fffffffffffff858.slot_);
      testing::internal::AssertHelper::operator=(&local_748,message);
      testing::internal::AssertHelper::~AssertHelper(&local_748);
      std::__cxx11::string::~string((string *)&local_740);
      testing::Message::~Message(&local_720);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
    __gnu_cxx::
    __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::operator++(&__end0_1);
  }
LAB_0028cf72:
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)&__range2);
  std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::~vector
            ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}